

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O2

ostream * ASDCP::JP2K::operator<<(ostream *strm,PictureDescriptor *PDesc)

{
  ushort uVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  ui8_t *puVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  char tmp_buf [512];
  
  poVar3 = std::operator<<(strm,"       AspectRatio: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->AspectRatio).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->AspectRatio).Denominator);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"          EditRate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->EditRate).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->EditRate).Denominator);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"        SampleRate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->SampleRate).Numerator);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->SampleRate).Denominator);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"       StoredWidth: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"      StoredHeight: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"             Rsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"             Xsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"             Ysize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"            XOsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"            YOsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"            XTsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"            YTsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"           XTOsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"           YTOsize: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm," ContainerDuration: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"-- JPEG 2000 Metadata --");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"    ImageComponents:");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"  bits  h-sep v-sep");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar7 = &PDesc->ImageComponents[0].YRsize;
  for (uVar10 = 0; (uVar10 < 3 && (uVar10 < PDesc->Csize)); uVar10 = uVar10 + 1) {
    poVar3 = std::operator<<(strm,"  ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
    poVar3 = (ostream *)
             std::ostream::operator<<(poVar3,((ImageComponent_t *)(puVar7 + -2))->Ssize + 1);
    poVar3 = std::operator<<(poVar3,"  ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
    poVar3 = std::operator<<(poVar3,puVar7[-1]);
    poVar3 = std::operator<<(poVar3," ");
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 5;
    poVar3 = std::operator<<(poVar3,*puVar7);
    std::endl<char,std::char_traits<char>>(poVar3);
    puVar7 = puVar7 + 3;
  }
  poVar3 = std::operator<<(strm,"               Scod: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(PDesc->CodingStyleDefault).Scod);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"   ProgressionOrder: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(ushort)(PDesc->CodingStyleDefault).SGcod.ProgressionOrder);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"     NumberOfLayers: ");
  uVar1 = *(ushort *)(PDesc->CodingStyleDefault).SGcod.NumberOfLayers;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 << 8 | uVar1 >> 8);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm," MultiCompTransform: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(ushort)(PDesc->CodingStyleDefault).SGcod.MultiCompTransform);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"DecompositionLevels: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.DecompositionLevels);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"     CodeblockWidth: ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockWidth)
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"    CodeblockHeight: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockHeight);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"     CodeblockStyle: ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.CodeblockStyle)
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"     Transformation: ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,(ushort)(PDesc->CodingStyleDefault).SPcod.Transformation)
  ;
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar10 = 0;
      (uVar10 < 0x20 && ((PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar10] != '\0'));
      uVar10 = uVar10 + 1) {
  }
  poVar3 = std::operator<<(strm,"          Precincts: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(short)uVar10);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"precinct dimensions:");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    poVar3 = std::operator<<(strm,"    ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,s_exp_lookup
                               [(PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar8] & 0xf]);
    poVar3 = std::operator<<(poVar3," x ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,s_exp_lookup
                               [(PDesc->CodingStyleDefault).SPcod.PrecinctSize[uVar8] >> 4]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<(strm,"               Sqcd: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)(PDesc->QuantizationDefault).Sqcd);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(strm,"              SPqcd: ");
  pcVar4 = (char *)Kumu::bin2hex((PDesc->QuantizationDefault).SPqcd,
                                 (uint)(PDesc->QuantizationDefault).SPqcdLength,tmp_buf,0x200);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((PDesc->Profile).N != 0) {
    poVar3 = std::operator<<(strm,"Profile:");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar10 = 0;
    while (uVar10 < (PDesc->Profile).N) {
      poVar3 = std::operator<<(strm,"              Pprf(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(uVar10 + 1));
      poVar3 = std::operator<<(poVar3,"): ");
      lVar5 = *(long *)poVar3;
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) | 0x200;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(PDesc->Profile).Pprf[uVar10]);
      lVar5 = *(long *)poVar3;
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
      *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffdff;
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar10 = uVar10 + 1;
    }
  }
  if ((PDesc->CorrespondingProfile).N != 0) {
    poVar3 = std::operator<<(strm,"Corresponding Profile:");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar10 = 0;
    while (uVar10 < (PDesc->CorrespondingProfile).N) {
      poVar3 = std::operator<<(strm,"              Pcpf(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(uVar10 + 1));
      poVar3 = std::operator<<(poVar3,"): ");
      lVar5 = *(long *)poVar3;
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) | 0x200;
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,(PDesc->CorrespondingProfile).Pcpf[uVar10]);
      lVar5 = *(long *)poVar3;
      lVar2 = *(long *)(lVar5 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
      *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffdff;
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar10 = uVar10 + 1;
    }
  }
  if (((PDesc->ExtendedCapabilities).N != -1) && ((PDesc->ExtendedCapabilities).Pcap != 0)) {
    poVar3 = std::operator<<(strm,"Extended Capabilities:");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(strm,"                     Pcap:");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar6 = 0;
    iVar9 = 0;
    iVar11 = 0x20;
    while( true ) {
      if (iVar11 == 0) break;
      if (((PDesc->ExtendedCapabilities).Pcap >> (uVar6 & 0x1f) & 1) != 0) {
        poVar3 = std::operator<<(strm,"              Ccap(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar11);
        poVar3 = std::operator<<(poVar3,"): ");
        lVar5 = *(long *)poVar3;
        lVar2 = *(long *)(lVar5 + -0x18);
        *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
        *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) | 0x200;
        lVar5 = (long)iVar9;
        iVar9 = iVar9 + 1;
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(PDesc->ExtendedCapabilities).Ccap[lVar5]);
        lVar5 = *(long *)poVar3;
        lVar2 = *(long *)(lVar5 + -0x18);
        *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
        *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffdff;
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      uVar6 = uVar6 + 1;
      iVar11 = iVar11 + -1;
    }
  }
  return strm;
}

Assistant:

std::ostream&
ASDCP::JP2K::operator << (std::ostream& strm, const PictureDescriptor& PDesc)
{
  strm << "       AspectRatio: " << PDesc.AspectRatio.Numerator << "/" << PDesc.AspectRatio.Denominator << std::endl;
  strm << "          EditRate: " << PDesc.EditRate.Numerator << "/" << PDesc.EditRate.Denominator << std::endl;
  strm << "        SampleRate: " << PDesc.SampleRate.Numerator << "/" << PDesc.SampleRate.Denominator << std::endl;
  strm << "       StoredWidth: " << (unsigned) PDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) PDesc.StoredHeight << std::endl;
  strm << "             Rsize: " << (unsigned) PDesc.Rsize << std::endl;
  strm << "             Xsize: " << (unsigned) PDesc.Xsize << std::endl;
  strm << "             Ysize: " << (unsigned) PDesc.Ysize << std::endl;
  strm << "            XOsize: " << (unsigned) PDesc.XOsize << std::endl;
  strm << "            YOsize: " << (unsigned) PDesc.YOsize << std::endl;
  strm << "            XTsize: " << (unsigned) PDesc.XTsize << std::endl;
  strm << "            YTsize: " << (unsigned) PDesc.YTsize << std::endl;
  strm << "           XTOsize: " << (unsigned) PDesc.XTOsize << std::endl;
  strm << "           YTOsize: " << (unsigned) PDesc.YTOsize << std::endl;
  strm << " ContainerDuration: " << (unsigned) PDesc.ContainerDuration << std::endl;

  strm << "-- JPEG 2000 Metadata --" << std::endl;
  strm << "    ImageComponents:" << std::endl;
  strm << "  bits  h-sep v-sep" << std::endl;

  ui32_t i;
  for ( i = 0; i < PDesc.Csize && i < MaxComponents; ++i )
    {
      strm << "  " << std::setw(4) << PDesc.ImageComponents[i].Ssize + 1 /* See ISO 15444-1, Table A11, for the origin of '+1' */
	   << "  " << std::setw(5) << PDesc.ImageComponents[i].XRsize
	   << " " << std::setw(5) << PDesc.ImageComponents[i].YRsize
	   << std::endl;
    }

  strm << "               Scod: " << (short) PDesc.CodingStyleDefault.Scod << std::endl;
  strm << "   ProgressionOrder: " << (short) PDesc.CodingStyleDefault.SGcod.ProgressionOrder << std::endl;
  strm << "     NumberOfLayers: " << (short) KM_i16_BE(Kumu::cp2i<ui16_t>(PDesc.CodingStyleDefault.SGcod.NumberOfLayers)) << std::endl;
  strm << " MultiCompTransform: " << (short) PDesc.CodingStyleDefault.SGcod.MultiCompTransform << std::endl;
  strm << "DecompositionLevels: " << (short) PDesc.CodingStyleDefault.SPcod.DecompositionLevels << std::endl;
  strm << "     CodeblockWidth: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockWidth << std::endl;
  strm << "    CodeblockHeight: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockHeight << std::endl;
  strm << "     CodeblockStyle: " << (short) PDesc.CodingStyleDefault.SPcod.CodeblockStyle << std::endl;
  strm << "     Transformation: " << (short) PDesc.CodingStyleDefault.SPcod.Transformation << std::endl;


  ui32_t precinct_set_size = 0;

  for ( i = 0; PDesc.CodingStyleDefault.SPcod.PrecinctSize[i] != 0 && i < MaxPrecincts; ++i )
    precinct_set_size++;

  strm << "          Precincts: " << (short) precinct_set_size << std::endl;
  strm << "precinct dimensions:" << std::endl;

  for ( i = 0; i < precinct_set_size && i < MaxPrecincts; ++i )
    strm << "    " << i + 1 << ": " << s_exp_lookup[PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]&0x0f] << " x "
	 << s_exp_lookup[(PDesc.CodingStyleDefault.SPcod.PrecinctSize[i]>>4)&0x0f] << std::endl;

  strm << "               Sqcd: " << (short) PDesc.QuantizationDefault.Sqcd << std::endl;

  char tmp_buf[MaxDefaults*2];
  strm << "              SPqcd: " << Kumu::bin2hex(PDesc.QuantizationDefault.SPqcd, PDesc.QuantizationDefault.SPqcdLength, tmp_buf, MaxDefaults*2)
       << std::endl;

  if (PDesc.Profile.N != 0) {
	  strm << "Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.Profile.N; i++) {
		  strm << "              Pprf(" << (i + 1) << "): "
			  << std::hex << std::showbase << PDesc.Profile.Pprf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.CorrespondingProfile.N != 0) {
	  strm << "Corresponding Profile:" << std::endl;

	  for (ui16_t i = 0; i < PDesc.CorrespondingProfile.N; i++) {

		  strm << "              Pcpf(" << (i + 1) << "): "
			  << std::hex << std::showbase <<  PDesc.CorrespondingProfile.Pcpf[i] << std::dec << std::noshowbase
			  << std::endl;
	  }
  }

  if (PDesc.ExtendedCapabilities.N != JP2K::NoExtendedCapabilitiesSignaled && PDesc.ExtendedCapabilities.Pcap != 0) {

	  strm << "Extended Capabilities:" << std::endl;


	  strm << "                     Pcap:" << PDesc.ExtendedCapabilities.Pcap << std::endl;

	  for (i32_t b = 0, i = 0; b < JP2K::MaxCapabilities; b++) {

		  if ((PDesc.ExtendedCapabilities.Pcap >> b) & 0x1) {

			  strm << "              Ccap(" << (JP2K::MaxCapabilities - b) << "): " <<
				  std::hex << std::showbase << PDesc.ExtendedCapabilities.Ccap[i++] << std::dec << std::noshowbase
				  << std::endl;

		  }
	  }
  }

  return strm;
}